

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_aesgcmsiv.cc
# Opt level: O0

void anon_unknown.dwarf_1dc958::gcm_siv_asm_polyval
               (uint8_t *out_tag,uint8_t *in,size_t in_len,uint8_t *ad,size_t ad_len,
               uint8_t *auth_key,uint8_t *nonce)

{
  bool bVar1;
  ulong local_100;
  size_t i;
  uint8_t length_block [16];
  uint8_t scratch [16];
  uint8_t htable [128];
  int htable_init;
  size_t in_blocks;
  size_t ad_blocks;
  uint8_t *auth_key_local;
  size_t ad_len_local;
  uint8_t *ad_local;
  size_t in_len_local;
  uint8_t *in_local;
  uint8_t *out_tag_local;
  
  ::OPENSSL_memset(out_tag,0,0x10);
  bVar1 = false;
  if ((8 < ad_len >> 4) || (8 < in_len >> 4)) {
    bVar1 = true;
    aesgcmsiv_htable_init(scratch + 8,auth_key);
  }
  if (bVar1) {
    aesgcmsiv_htable_polyval(scratch + 8,ad,ad_len & 0xfffffffffffffff0,out_tag);
  }
  else {
    aesgcmsiv_polyval_horner(out_tag,auth_key,ad,ad_len >> 4);
  }
  if ((ad_len & 0xf) != 0) {
    ::OPENSSL_memset(length_block + 8,0,0x10);
    ::OPENSSL_memcpy(length_block + 8,ad + (ad_len & 0xfffffffffffffff0),ad_len & 0xf);
    aesgcmsiv_polyval_horner(out_tag,auth_key,length_block + 8,1);
  }
  if (bVar1) {
    aesgcmsiv_htable_polyval(scratch + 8,in,in_len & 0xfffffffffffffff0,out_tag);
  }
  else {
    aesgcmsiv_polyval_horner(out_tag,auth_key,in,in_len >> 4);
  }
  if ((in_len & 0xf) != 0) {
    ::OPENSSL_memset(length_block + 8,0,0x10);
    ::OPENSSL_memcpy(length_block + 8,in + (in_len & 0xfffffffffffffff0),in_len & 0xf);
    aesgcmsiv_polyval_horner(out_tag,auth_key,length_block + 8,1);
  }
  CRYPTO_store_u64_le(&i,ad_len << 3);
  CRYPTO_store_u64_le(length_block,in_len << 3);
  aesgcmsiv_polyval_horner(out_tag,auth_key,&i,1);
  for (local_100 = 0; local_100 < 0xc; local_100 = local_100 + 1) {
    out_tag[local_100] = out_tag[local_100] ^ nonce[local_100];
  }
  out_tag[0xf] = out_tag[0xf] & 0x7f;
  return;
}

Assistant:

void gcm_siv_asm_polyval(uint8_t out_tag[16], const uint8_t *in, size_t in_len,
                         const uint8_t *ad, size_t ad_len,
                         const uint8_t auth_key[16], const uint8_t nonce[12]) {
  OPENSSL_memset(out_tag, 0, 16);
  const size_t ad_blocks = ad_len / 16;
  const size_t in_blocks = in_len / 16;
  int htable_init = 0;
  alignas(16) uint8_t htable[16 * 8];

  if (ad_blocks > 8 || in_blocks > 8) {
    htable_init = 1;
    aesgcmsiv_htable_init(htable, auth_key);
  }

  if (htable_init) {
    aesgcmsiv_htable_polyval(htable, ad, ad_len & ~15, out_tag);
  } else {
    aesgcmsiv_polyval_horner(out_tag, auth_key, ad, ad_blocks);
  }

  uint8_t scratch[16];
  if (ad_len & 15) {
    OPENSSL_memset(scratch, 0, sizeof(scratch));
    OPENSSL_memcpy(scratch, &ad[ad_len & ~15], ad_len & 15);
    aesgcmsiv_polyval_horner(out_tag, auth_key, scratch, 1);
  }

  if (htable_init) {
    aesgcmsiv_htable_polyval(htable, in, in_len & ~15, out_tag);
  } else {
    aesgcmsiv_polyval_horner(out_tag, auth_key, in, in_blocks);
  }

  if (in_len & 15) {
    OPENSSL_memset(scratch, 0, sizeof(scratch));
    OPENSSL_memcpy(scratch, &in[in_len & ~15], in_len & 15);
    aesgcmsiv_polyval_horner(out_tag, auth_key, scratch, 1);
  }

  uint8_t length_block[16];
  CRYPTO_store_u64_le(length_block, ad_len * 8);
  CRYPTO_store_u64_le(length_block + 8, in_len * 8);
  aesgcmsiv_polyval_horner(out_tag, auth_key, length_block, 1);

  for (size_t i = 0; i < 12; i++) {
    out_tag[i] ^= nonce[i];
  }

  out_tag[15] &= 0x7f;
}